

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O3

Result __thiscall
ruckig::TargetCalculator<3UL,_ruckig::StandardVector>::calculate<false>
          (TargetCalculator<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *inp,
          Trajectory<3UL,_ruckig::StandardVector> *traj,double delta_time,bool *was_interrupted)

{
  double *pdVar1;
  size_t *psVar2;
  Profile *this_00;
  undefined8 *puVar3;
  double dVar4;
  ControlInterface CVar5;
  ControlSigns CVar6;
  pointer paVar7;
  undefined8 uVar8;
  char cVar9;
  bool bVar10;
  long lVar11;
  Synchronization *pSVar12;
  ControlInterface *pCVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  Profile *pPVar17;
  long lVar18;
  ulong uVar19;
  StandardVector<Block,_3UL> *pSVar20;
  byte bVar21;
  long lVar22;
  Block *pBVar23;
  long lVar24;
  ControlInterface *pCVar25;
  long lVar26;
  long lVar27;
  _Storage<unsigned_long,_true> _Var28;
  ulong uVar29;
  bool *pbVar30;
  bool discrete_duration;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  optional<double> t_min;
  PositionFirstOrderStep1 step1;
  _Storage<unsigned_long,_true> local_e70;
  char local_e68;
  Container<double> *local_e60;
  double local_e58;
  ControlInterface *local_e50;
  Profile local_e48 [6];
  
  *was_interrupted = false;
  local_e58 = delta_time;
  std::vector<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
  ::resize(&traj->profiles,1);
  local_e60 = &traj->cumulative_times;
  std::vector<double,_std::allocator<double>_>::resize(local_e60,1);
  uVar29 = this->degrees_of_freedom;
  if (uVar29 == 0) {
    discrete_duration = inp->duration_discretization == Discrete;
    bVar21 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_engaged;
  }
  else {
    pCVar25 = &inp->control_interface;
    lVar27 = 0;
    lVar18 = 0;
    lVar26 = 0;
    uVar19 = 0;
    local_e50 = pCVar25;
    do {
      if ((inp->min_velocity).super__Optional_base<std::array<double,_3UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == true) {
        dVar31 = *(double *)
                  ((long)&(((optional<std::array<double,_3UL>_> *)(&inp->max_jerk + 1))->
                          super__Optional_base<std::array<double,_3UL>,_true,_true>)._M_payload.
                          super__Optional_payload_base<std::array<double,_3UL>_>._M_payload +
                  uVar19 * 8);
      }
      else {
        dVar31 = -(inp->max_velocity)._M_elems[uVar19];
      }
      paVar7 = (traj->profiles).
               super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->inp_min_velocity)._M_elems[uVar19] = dVar31;
      if ((inp->min_acceleration).super__Optional_base<std::array<double,_3UL>,_true,_true>.
          _M_payload.super__Optional_payload_base<std::array<double,_3UL>_>._M_engaged == true) {
        dVar34 = *(double *)((long)(&inp->max_jerk + 2) + uVar19 * 8 + 8);
      }
      else {
        dVar34 = -(inp->max_acceleration)._M_elems[uVar19];
      }
      (this->inp_min_acceleration)._M_elems[uVar19] = dVar34;
      pCVar13 = (ControlInterface *)((long)(&inp->enabled + 1) + lVar18 + 1);
      if ((inp->per_dof_control_interface).
          super__Optional_base<std::array<ruckig::ControlInterface,_3UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<ruckig::ControlInterface,_3UL>_>._M_engaged ==
          false) {
        pCVar13 = pCVar25;
      }
      CVar5 = *pCVar13;
      (this->inp_per_dof_control_interface)._M_elems[uVar19] = CVar5;
      pSVar12 = (Synchronization *)((long)(&inp->enabled + 6) + lVar18 + 2);
      if ((inp->per_dof_synchronization).
          super__Optional_base<std::array<ruckig::Synchronization,_3UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<ruckig::Synchronization,_3UL>_>._M_engaged ==
          false) {
        pSVar12 = &inp->synchronization;
      }
      (this->inp_per_dof_synchronization)._M_elems[uVar19] = *pSVar12;
      if ((inp->enabled)._M_elems[uVar19] == false) {
        *(double *)((long)&paVar7->_M_elems[0].p + lVar26 + 0x38U) =
             (inp->current_position)._M_elems[uVar19];
        *(double *)((long)&paVar7->_M_elems[0].v + lVar26 + 0x38U) =
             (inp->current_velocity)._M_elems[uVar19];
        *(double *)((long)&paVar7->_M_elems[0].a + lVar26 + 0x38U) =
             (inp->current_acceleration)._M_elems[uVar19];
        *(undefined8 *)((long)&paVar7->_M_elems[0].t_sum + lVar26 + 0x30U) = 0;
        *(undefined8 *)((long)&(this->blocks)._M_elems[0].t_min + lVar27 * 4) = 0;
        if (*(char *)((long)&(this->blocks)._M_elems[0].a.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                             super__Optional_payload_base<ruckig::Block::Interval>._M_engaged +
                     lVar27 * 4) == '\x01') {
          *(undefined1 *)
           ((long)&(this->blocks)._M_elems[0].a.
                   super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                   super__Optional_payload_base<ruckig::Block::Interval>._M_engaged + lVar27 * 4) =
               0;
        }
        if (*(char *)((long)&(this->blocks)._M_elems[0].b.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                             super__Optional_payload_base<ruckig::Block::Interval>._M_engaged +
                     lVar27 * 4) == '\x01') {
          *(undefined1 *)
           ((long)&(this->blocks)._M_elems[0].b.
                   super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                   super__Optional_payload_base<ruckig::Block::Interval>._M_engaged + lVar27 * 4) =
               0;
        }
      }
      else {
        if (CVar5 == Velocity) {
          dVar31 = (inp->max_jerk)._M_elems[uVar19];
          if (ABS(dVar31) == INFINITY) {
            ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
          }
          else {
            ruckig::BrakeProfile::get_velocity_brake_trajectory
                      ((inp->current_acceleration)._M_elems[uVar19],
                       (inp->max_acceleration)._M_elems[uVar19],dVar34,dVar31);
          }
          dVar4 = (inp->current_position)._M_elems[uVar19];
          dVar31 = (inp->current_velocity)._M_elems[uVar19];
          dVar34 = (inp->current_acceleration)._M_elems[uVar19];
          dVar33 = (inp->target_velocity)._M_elems[uVar19];
          dVar32 = (inp->target_acceleration)._M_elems[uVar19];
          lVar11 = 0x220;
          lVar14 = 0x228;
          lVar16 = 0x128;
          lVar22 = 0xe8;
          lVar24 = 0xa8;
LAB_0010b5fa:
          *(double *)((long)&paVar7->_M_elems[0].t + lVar26 + lVar24) = dVar34;
          *(double *)((long)&paVar7->_M_elems[0].t + lVar26 + lVar22) = dVar31;
          *(double *)((long)&paVar7->_M_elems[0].t + lVar26 + lVar16) = dVar4;
          *(double *)((long)&paVar7->_M_elems[0].t + lVar26 + lVar14) = dVar32;
          *(double *)((long)&paVar7->_M_elems[0].t + lVar26 + lVar11) = dVar33;
        }
        else if (CVar5 == Position) {
          dVar33 = (inp->max_jerk)._M_elems[uVar19];
          if (ABS(dVar33) == INFINITY) {
            dVar33 = (inp->max_acceleration)._M_elems[uVar19];
            if (ABS(dVar33) != INFINITY) {
              ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                        ((inp->current_velocity)._M_elems[uVar19],
                         (inp->max_velocity)._M_elems[uVar19],dVar31,dVar33,dVar34);
            }
          }
          else {
            ruckig::BrakeProfile::get_position_brake_trajectory
                      ((inp->current_velocity)._M_elems[uVar19],
                       (inp->current_acceleration)._M_elems[uVar19],
                       (inp->max_velocity)._M_elems[uVar19],dVar31,
                       (inp->max_acceleration)._M_elems[uVar19],dVar34,dVar33);
          }
          dVar31 = (inp->current_position)._M_elems[uVar19];
          dVar34 = (inp->current_velocity)._M_elems[uVar19];
          dVar33 = (inp->target_position)._M_elems[uVar19];
          dVar32 = (inp->target_velocity)._M_elems[uVar19];
          dVar4 = (inp->target_acceleration)._M_elems[uVar19];
          *(double *)((long)&paVar7->_M_elems[0].a + lVar26) =
               (inp->current_acceleration)._M_elems[uVar19];
          lVar11 = 0x218;
          lVar14 = 0x220;
          lVar16 = 0x228;
          lVar22 = 0x128;
          lVar24 = 0xe8;
          goto LAB_0010b5fa;
        }
        if (ABS((inp->max_jerk)._M_elems[uVar19]) == INFINITY) {
          if (ABS((inp->max_acceleration)._M_elems[uVar19]) != INFINITY) {
            BrakeProfile::finalize_second_order
                      ((BrakeProfile *)((long)&paVar7->_M_elems[0].brake + lVar26),
                       (double *)((long)&paVar7->_M_elems[0].p + lVar26),
                       (double *)((long)&paVar7->_M_elems[0].v + lVar26),
                       (double *)((long)&paVar7->_M_elems[0].a + lVar26));
          }
        }
        else {
          BrakeProfile::finalize
                    ((BrakeProfile *)((long)&paVar7->_M_elems[0].brake + lVar26),
                     (double *)((long)&paVar7->_M_elems[0].p + lVar26),
                     (double *)((long)&paVar7->_M_elems[0].v + lVar26),
                     (double *)((long)&paVar7->_M_elems[0].a + lVar26));
        }
        pBVar23 = (Block *)((long)&paVar7->_M_elems[0].t + lVar26);
        CVar5 = (this->inp_per_dof_control_interface)._M_elems[uVar19];
        if (CVar5 == Velocity) {
          dVar31 = (inp->max_jerk)._M_elems[uVar19];
          if (ABS(dVar31) == INFINITY) {
            ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                      ((VelocitySecondOrderStep1 *)local_e48,
                       *(double *)((long)&paVar7->_M_elems[0].v + lVar26),
                       *(double *)((long)&paVar7->_M_elems[0].accel + lVar26 + 0x60U),
                       (inp->max_acceleration)._M_elems[uVar19],
                       (this->inp_min_acceleration)._M_elems[uVar19]);
            cVar9 = ruckig::VelocitySecondOrderStep1::get_profile(local_e48,pBVar23);
            pCVar25 = local_e50;
          }
          else {
            ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                      ((VelocityThirdOrderStep1 *)local_e48,
                       *(double *)((long)&paVar7->_M_elems[0].v + lVar26),
                       *(double *)((long)&paVar7->_M_elems[0].a + lVar26),
                       *(double *)((long)&paVar7->_M_elems[0].accel + lVar26 + 0x60U),
                       *(double *)((long)&paVar7->_M_elems[0].accel + lVar26 + 0x68U),
                       (inp->max_acceleration)._M_elems[uVar19],
                       (this->inp_min_acceleration)._M_elems[uVar19],dVar31);
            cVar9 = ruckig::VelocityThirdOrderStep1::get_profile(local_e48,pBVar23);
            pCVar25 = local_e50;
          }
        }
        else {
          if (CVar5 != Position) goto LAB_0010bb79;
          dVar31 = (inp->max_jerk)._M_elems[uVar19];
          if (ABS(dVar31) == INFINITY) {
            dVar31 = (inp->max_acceleration)._M_elems[uVar19];
            if (ABS(dVar31) == INFINITY) {
              ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                        ((PositionFirstOrderStep1 *)local_e48,
                         *(double *)((long)&paVar7->_M_elems[0].p + lVar26),
                         *(double *)((long)&paVar7->_M_elems[0].accel + lVar26 + 0x58U),
                         (inp->max_velocity)._M_elems[uVar19],
                         (this->inp_min_velocity)._M_elems[uVar19]);
              cVar9 = ruckig::PositionFirstOrderStep1::get_profile(local_e48,pBVar23);
              pCVar25 = local_e50;
            }
            else {
              ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                        ((PositionSecondOrderStep1 *)local_e48,
                         *(double *)((long)&paVar7->_M_elems[0].p + lVar26),
                         *(double *)((long)&paVar7->_M_elems[0].v + lVar26),
                         *(double *)((long)&paVar7->_M_elems[0].accel + lVar26 + 0x58U),
                         *(double *)((long)&paVar7->_M_elems[0].accel + lVar26 + 0x60U),
                         (inp->max_velocity)._M_elems[uVar19],
                         (this->inp_min_velocity)._M_elems[uVar19],dVar31,
                         (this->inp_min_acceleration)._M_elems[uVar19]);
              cVar9 = ruckig::PositionSecondOrderStep1::get_profile(local_e48,pBVar23);
              pCVar25 = local_e50;
            }
          }
          else {
            ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                      ((PositionThirdOrderStep1 *)local_e48,
                       *(double *)((long)&paVar7->_M_elems[0].p + lVar26),
                       *(double *)((long)&paVar7->_M_elems[0].v + lVar26),
                       *(double *)((long)&paVar7->_M_elems[0].a + lVar26),
                       *(double *)((long)&paVar7->_M_elems[0].accel + lVar26 + 0x58U),
                       *(double *)((long)&paVar7->_M_elems[0].accel + lVar26 + 0x60U),
                       *(double *)((long)&paVar7->_M_elems[0].accel + lVar26 + 0x68U),
                       (inp->max_velocity)._M_elems[uVar19],
                       (this->inp_min_velocity)._M_elems[uVar19],
                       (inp->max_acceleration)._M_elems[uVar19],
                       (this->inp_min_acceleration)._M_elems[uVar19],dVar31);
            cVar9 = ruckig::PositionThirdOrderStep1::get_profile(local_e48,pBVar23);
            pCVar25 = local_e50;
          }
        }
        if (cVar9 == '\0') {
LAB_0010bb79:
          dVar31 = (inp->max_acceleration)._M_elems[uVar19];
          if ((((dVar31 != 0.0) || (NAN(dVar31))) &&
              ((dVar31 = (this->inp_min_acceleration)._M_elems[uVar19], dVar31 != 0.0 ||
               (NAN(dVar31))))) &&
             ((dVar31 = (inp->max_jerk)._M_elems[uVar19], dVar31 != 0.0 || (NAN(dVar31))))) {
            return ErrorExecutionTimeCalculation;
          }
          return ErrorZeroLimits;
        }
        (traj->independent_min_durations)._M_elems[uVar19] =
             *(double *)((long)&(this->blocks)._M_elems[0].t_min + lVar27 * 4);
        uVar29 = this->degrees_of_freedom;
        local_e50 = pCVar25;
      }
      uVar19 = uVar19 + 1;
      lVar26 = lVar26 + 0x240;
      lVar18 = lVar18 + 4;
      lVar27 = lVar27 + 0x1be;
    } while (uVar19 < uVar29);
    discrete_duration = inp->duration_discretization == Discrete;
    bVar21 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_engaged;
    if ((uVar29 == 1 && (bVar21 & 1) == 0) && !discrete_duration) {
      traj->duration = (this->blocks)._M_elems[0].t_min;
      memcpy((traj->profiles).
             super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&this->blocks,0x23c);
      *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = traj->duration;
      return Working;
    }
  }
  local_e68 = '\0';
  pdVar1 = &traj->duration;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)bVar21;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = 0;
  bVar10 = synchronize(this,t_min,pdVar1,(optional<unsigned_long> *)&local_e70,
                       (traj->profiles).
                       super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,discrete_duration,local_e58);
  if (!bVar10) {
    if (this->degrees_of_freedom != 0) {
      sVar15 = 0;
      do {
        dVar31 = (inp->max_acceleration)._M_elems[sVar15];
        if ((dVar31 == 0.0) && (!NAN(dVar31))) {
          return ErrorZeroLimits;
        }
        dVar31 = (this->inp_min_acceleration)._M_elems[sVar15];
        if ((dVar31 == 0.0) && (!NAN(dVar31))) {
          return ErrorZeroLimits;
        }
        dVar31 = (inp->max_jerk)._M_elems[sVar15];
        if ((dVar31 == 0.0) && (!NAN(dVar31))) {
          return ErrorZeroLimits;
        }
        sVar15 = sVar15 + 1;
      } while (this->degrees_of_freedom != sVar15);
    }
    return ErrorSynchronizationCalculation;
  }
  psVar2 = &this->degrees_of_freedom;
  if (*psVar2 == 0) {
    bVar10 = true;
  }
  else {
    pSVar20 = &this->blocks;
    lVar18 = 0;
    _Var28._M_value = 0;
    do {
      if (((inp->enabled)._M_elems[_Var28._M_value] == true) &&
         ((this->inp_per_dof_synchronization)._M_elems[_Var28._M_value] == None)) {
        memcpy((void *)((long)&((traj->profiles).
                                super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar18),
               pSVar20,0x23c);
        dVar31 = pSVar20->_M_elems[0].t_min;
        if (traj->duration <= dVar31 && dVar31 != traj->duration) {
          *pdVar1 = dVar31;
          local_e68 = '\x01';
          local_e70 = _Var28;
        }
      }
      _Var28._M_value = _Var28._M_value + 1;
      lVar18 = lVar18 + 0x240;
      pSVar20 = (StandardVector<Block,_3UL> *)(pSVar20->_M_elems + 1);
    } while (_Var28._M_value < *psVar2);
    bVar10 = *psVar2 == 0;
  }
  dVar31 = *pdVar1;
  *(local_e60->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
   _M_start = dVar31;
  if (7600.0 < dVar31) {
    return ErrorTrajectoryDuration;
  }
  if ((dVar31 == 0.0) && (!NAN(dVar31))) {
    if (bVar10) {
      return Working;
    }
    pSVar20 = &this->blocks;
    lVar18 = 0;
    uVar29 = 0;
    do {
      memcpy((void *)((long)&((traj->profiles).
                              super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar18),
             pSVar20,0x23c);
      uVar29 = uVar29 + 1;
      pSVar20 = (StandardVector<Block,_3UL> *)(pSVar20->_M_elems + 1);
      lVar18 = lVar18 + 0x240;
    } while (uVar29 < *psVar2);
    return Working;
  }
  if ((discrete_duration == false) &&
     (pSVar12 = std::
                __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>>
                          (&this->inp_per_dof_synchronization,psVar2),
     pSVar12 == (Synchronization *)psVar2)) {
    return Working;
  }
  if (local_e68 == '\x01') {
    pSVar12 = std::
              __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_pred<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>>
                        (&this->inp_per_dof_synchronization,psVar2);
    _Var28 = local_e70;
    if (pSVar12 != (Synchronization *)psVar2) {
      if (local_e68 == '\0') {
        std::__throw_bad_optional_access();
      }
      paVar7 = (traj->profiles).
               super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar10 = is_input_collinear(this,inp,*(Direction *)
                                            ((long)(paVar7->_M_elems + (long)local_e70) + 0x234),
                                  local_e70._M_value);
      if (bVar10) {
        uVar29 = *psVar2;
        if (uVar29 != 0) {
          pPVar17 = paVar7->_M_elems + (long)_Var28;
          bVar21 = 1;
          lVar18 = 0;
          uVar19 = 0;
          do {
            if (((inp->enabled)._M_elems[uVar19] == true) &&
               (((local_e68 != '\x01' || (uVar19 != local_e70._M_value)) &&
                ((this->inp_per_dof_synchronization)._M_elems[uVar19] == Phase)))) {
              paVar7 = (traj->profiles).
                       super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              this_00 = (Profile *)((long)&paVar7->_M_elems[0].t + lVar18);
              *(double *)((long)&paVar7->_M_elems[0].t + lVar18 + 0x30) =
                   *(double *)((long)&pPVar17->t + 0x30);
              uVar8 = (pPVar17->t)._M_elems[0];
              dVar32 = *(double *)((long)&pPVar17->t + 8);
              dVar34 = *(double *)((long)&pPVar17->t + 0x10);
              dVar33 = *(double *)((long)&pPVar17->t + 0x18);
              dVar31 = *(double *)((long)&pPVar17->t + 0x28);
              pdVar1 = (double *)((long)&paVar7->_M_elems[0].t + lVar18 + 0x20);
              *pdVar1 = *(double *)((long)&pPVar17->t + 0x20);
              pdVar1[1] = dVar31;
              pdVar1 = (double *)((long)&paVar7->_M_elems[0].t + lVar18 + 0x10);
              *pdVar1 = dVar34;
              pdVar1[1] = dVar33;
              puVar3 = (undefined8 *)((long)&paVar7->_M_elems[0].t + lVar18);
              *puVar3 = uVar8;
              puVar3[1] = dVar32;
              CVar6 = pPVar17->control_signs;
              *(ControlSigns *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x78U) = CVar6;
              CVar5 = (this->inp_per_dof_control_interface)._M_elems[uVar19];
              if (CVar5 == Velocity) {
                if (CVar6 == UDUD) {
                  dVar31 = (inp->max_jerk)._M_elems[uVar19];
                  dVar34 = (this->new_phase_control)._M_elems[uVar19];
                  if (ABS(dVar31) == INFINITY) {
                    bVar10 = false;
                    if ((dVar34 < (inp->max_acceleration)._M_elems[uVar19] + 1e-12) &&
                       ((this->inp_min_acceleration)._M_elems[uVar19] + -1e-12 < dVar34)) {
                      bVar10 = Profile::
                               check_for_second_order_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,dVar34);
                    }
                  }
                  else {
                    if (ABS(dVar31) + 1e-12 <= ABS(dVar34)) goto LAB_0010c18f;
                    bVar10 = Profile::
                             check_for_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,dVar34,(inp->max_acceleration)._M_elems[uVar19],
                                        (this->inp_min_acceleration)._M_elems[uVar19]);
                  }
                }
                else {
                  if (CVar6 != UDDU) goto LAB_0010c194;
                  dVar31 = (inp->max_jerk)._M_elems[uVar19];
                  dVar34 = (this->new_phase_control)._M_elems[uVar19];
                  if (ABS(dVar31) == INFINITY) {
                    bVar10 = false;
                    if ((dVar34 < (inp->max_acceleration)._M_elems[uVar19] + 1e-12) &&
                       ((this->inp_min_acceleration)._M_elems[uVar19] + -1e-12 < dVar34)) {
                      bVar10 = Profile::
                               check_for_second_order_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,dVar34);
                    }
                  }
                  else {
                    if (ABS(dVar31) + 1e-12 <= ABS(dVar34)) goto LAB_0010c18f;
                    bVar10 = Profile::
                             check_for_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,dVar34,(inp->max_acceleration)._M_elems[uVar19],
                                        (this->inp_min_acceleration)._M_elems[uVar19]);
                  }
                }
                goto LAB_0010c191;
              }
              if (CVar5 == Position) {
                if (CVar6 == UDUD) {
                  dVar31 = (inp->max_jerk)._M_elems[uVar19];
                  dVar34 = (this->new_phase_control)._M_elems[uVar19];
                  if (ABS(dVar31) == INFINITY) {
                    dVar31 = (this->inp_min_acceleration)._M_elems[uVar19] + -1e-12;
                    if (dVar34 <= dVar31) {
LAB_0010c18f:
                      bVar10 = false;
                    }
                    else {
                      dVar33 = -dVar34;
                      dVar32 = (inp->max_acceleration)._M_elems[uVar19] + 1e-12;
                      bVar10 = false;
                      if (((dVar33 < dVar32) && (dVar31 < dVar33)) && (dVar34 < dVar32)) {
                        bVar10 = Profile::
                                 check_for_second_order<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                           (this_00,dVar34,dVar33,
                                            (inp->max_velocity)._M_elems[uVar19],
                                            (this->inp_min_velocity)._M_elems[uVar19]);
                      }
                    }
                  }
                  else {
                    if (ABS(dVar31) + 1e-12 <= ABS(dVar34)) goto LAB_0010c18f;
                    bVar10 = Profile::
                             check<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7,false>
                                       (this_00,dVar34,(inp->max_velocity)._M_elems[uVar19],
                                        (this->inp_min_velocity)._M_elems[uVar19],
                                        (inp->max_acceleration)._M_elems[uVar19],
                                        (this->inp_min_acceleration)._M_elems[uVar19]);
                  }
LAB_0010c191:
                  bVar21 = bVar21 & bVar10;
                }
                else if (CVar6 == UDDU) {
                  dVar31 = (inp->max_jerk)._M_elems[uVar19];
                  if (ABS(dVar31) == INFINITY) {
                    dVar31 = (inp->max_acceleration)._M_elems[uVar19];
                    dVar34 = (this->new_phase_control)._M_elems[uVar19];
                    if (ABS(dVar31) == INFINITY) {
                      bVar10 = false;
                      if ((dVar34 < (inp->max_velocity)._M_elems[uVar19] + 1e-12) &&
                         ((this->inp_min_velocity)._M_elems[uVar19] + -1e-12 < dVar34)) {
                        bVar10 = Profile::
                                 check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                           (this_00,dVar34);
                      }
                    }
                    else {
                      dVar33 = (this->inp_min_acceleration)._M_elems[uVar19] + -1e-12;
                      if (dVar34 <= dVar33) goto LAB_0010c18f;
                      dVar32 = -dVar34;
                      dVar31 = dVar31 + 1e-12;
                      bVar10 = false;
                      if (((dVar32 < dVar31) && (dVar34 < dVar31)) && (dVar33 < dVar32)) {
                        bVar10 = Profile::
                                 check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                           (this_00,dVar34,dVar32,
                                            (inp->max_velocity)._M_elems[uVar19],
                                            (this->inp_min_velocity)._M_elems[uVar19]);
                      }
                    }
                  }
                  else {
                    dVar34 = (this->new_phase_control)._M_elems[uVar19];
                    if (ABS(dVar31) + 1e-12 <= ABS(dVar34)) goto LAB_0010c18f;
                    bVar10 = Profile::
                             check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                                       (this_00,dVar34,(inp->max_velocity)._M_elems[uVar19],
                                        (this->inp_min_velocity)._M_elems[uVar19],
                                        (inp->max_acceleration)._M_elems[uVar19],
                                        (this->inp_min_acceleration)._M_elems[uVar19]);
                  }
                  goto LAB_0010c191;
                }
              }
LAB_0010c194:
              *(ReachedLimits *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x70U) =
                   pPVar17->limits;
              uVar29 = *psVar2;
            }
            uVar19 = uVar19 + 1;
            lVar18 = lVar18 + 0x240;
          } while (uVar19 < uVar29);
          if (bVar21 == 0) goto LAB_0010c1eb;
        }
        pSVar12 = std::
                  __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<3ul,ruckig::StandardVector>::calculate<false>(ruckig::InputParameter<3ul,ruckig::StandardVector>const&,ruckig::Trajectory<3ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>>
                            (&this->inp_per_dof_synchronization,psVar2);
        if (pSVar12 == (Synchronization *)psVar2) {
          return Working;
        }
        if (*psVar2 == 0) {
          return Working;
        }
        goto LAB_0010c1f6;
      }
    }
  }
LAB_0010c1eb:
  if (*psVar2 == 0) {
    return Working;
  }
LAB_0010c1f6:
  pbVar30 = &(this->blocks)._M_elems[0].b.super__Optional_base<ruckig::Block::Interval,_true,_true>.
             _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
  lVar18 = 0;
  uVar29 = 0;
  do {
    if (((local_e68 == '\x01') && (uVar29 == local_e70._M_value)) ||
       (bVar10 = true, (this->inp_per_dof_synchronization)._M_elems[uVar29] == None)) {
      bVar10 = discrete_duration;
    }
    if ((bVar10 != false) && ((inp->enabled)._M_elems[uVar29] != false)) {
      paVar7 = (traj->profiles).
               super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar31 = (traj->duration - *(double *)((long)&paVar7->_M_elems[0].brake + lVar18)) -
               *(double *)((long)&paVar7->_M_elems[0].accel + lVar18);
      if (((this->inp_per_dof_synchronization)._M_elems[uVar29] != TimeIfNecessary) ||
         ((2.220446049250313e-16 <= ABS((inp->target_velocity)._M_elems[uVar29]) ||
          (2.220446049250313e-16 <= ABS((inp->target_acceleration)._M_elems[uVar29]))))) {
        pBVar23 = (this->blocks)._M_elems + uVar29;
        if (4.440892098500626e-16 <= ABS(dVar31 - *(double *)(pbVar30 + -0x4b0))) {
          if ((pbVar30[-600] != true) ||
             (4.440892098500626e-16 <= ABS(dVar31 - *(double *)(pbVar30 + -0x4a0)))) {
            if ((*pbVar30 != true) ||
               (4.440892098500626e-16 <= ABS(dVar31 - *(double *)(pbVar30 + -0x248)))) {
              CVar5 = (this->inp_per_dof_control_interface)._M_elems[uVar29];
              if (CVar5 == Velocity) {
                dVar34 = (inp->max_jerk)._M_elems[uVar29];
                if (ABS(dVar34) == INFINITY) {
                  ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                            ((VelocitySecondOrderStep2 *)local_e48,dVar31,
                             *(double *)((long)&paVar7->_M_elems[0].v + lVar18),
                             *(double *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x60U),
                             (inp->max_acceleration)._M_elems[uVar29],
                             (this->inp_min_acceleration)._M_elems[uVar29]);
                  cVar9 = ruckig::VelocitySecondOrderStep2::get_profile(local_e48);
                }
                else {
                  ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                            ((VelocityThirdOrderStep2 *)local_e48,dVar31,
                             *(double *)((long)&paVar7->_M_elems[0].v + lVar18),
                             *(double *)((long)&paVar7->_M_elems[0].a + lVar18),
                             *(double *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x60U),
                             *(double *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x68U),
                             (inp->max_acceleration)._M_elems[uVar29],
                             (this->inp_min_acceleration)._M_elems[uVar29],dVar34);
                  cVar9 = ruckig::VelocityThirdOrderStep2::get_profile(local_e48);
                }
              }
              else {
                if (CVar5 != Position) {
                  return ErrorSynchronizationCalculation;
                }
                dVar34 = (inp->max_jerk)._M_elems[uVar29];
                if (ABS(dVar34) == INFINITY) {
                  dVar34 = (inp->max_acceleration)._M_elems[uVar29];
                  if (ABS(dVar34) == INFINITY) {
                    ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                              ((PositionFirstOrderStep2 *)local_e48,dVar31,
                               *(double *)((long)&paVar7->_M_elems[0].p + lVar18),
                               *(double *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x58U),
                               (inp->max_velocity)._M_elems[uVar29],
                               (this->inp_min_velocity)._M_elems[uVar29]);
                    cVar9 = ruckig::PositionFirstOrderStep2::get_profile(local_e48);
                  }
                  else {
                    ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                              ((PositionSecondOrderStep2 *)local_e48,dVar31,
                               *(double *)((long)&paVar7->_M_elems[0].p + lVar18),
                               *(double *)((long)&paVar7->_M_elems[0].v + lVar18),
                               *(double *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x58U),
                               *(double *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x60U),
                               (inp->max_velocity)._M_elems[uVar29],
                               (this->inp_min_velocity)._M_elems[uVar29],dVar34,
                               (this->inp_min_acceleration)._M_elems[uVar29]);
                    cVar9 = ruckig::PositionSecondOrderStep2::get_profile(local_e48);
                  }
                }
                else {
                  ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                            ((PositionThirdOrderStep2 *)local_e48,dVar31,
                             *(double *)((long)&paVar7->_M_elems[0].p + lVar18),
                             *(double *)((long)&paVar7->_M_elems[0].v + lVar18),
                             *(double *)((long)&paVar7->_M_elems[0].a + lVar18),
                             *(double *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x58U),
                             *(double *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x60U),
                             *(double *)((long)&paVar7->_M_elems[0].accel + lVar18 + 0x68U),
                             (inp->max_velocity)._M_elems[uVar29],
                             (this->inp_min_velocity)._M_elems[uVar29],
                             (inp->max_acceleration)._M_elems[uVar29],
                             (this->inp_min_acceleration)._M_elems[uVar29],dVar34);
                  cVar9 = ruckig::PositionThirdOrderStep2::get_profile(local_e48);
                }
              }
              if (cVar9 == '\0') {
                return ErrorSynchronizationCalculation;
              }
              goto LAB_0010c30f;
            }
            pBVar23 = (Block *)((long)&(pBVar23->b).
                                       super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                       _M_payload.
                                       super__Optional_payload_base<ruckig::Block::Interval>.
                                       _M_payload + 0x10);
          }
          else {
            pBVar23 = (Block *)((long)&(pBVar23->a).
                                       super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                       _M_payload.
                                       super__Optional_payload_base<ruckig::Block::Interval>.
                                       _M_payload + 0x10);
          }
        }
      }
      else {
        pBVar23 = (Block *)(pbVar30 + -0x6f0);
      }
      memcpy((void *)((long)&paVar7->_M_elems[0].t + lVar18),pBVar23,0x23c);
    }
LAB_0010c30f:
    uVar29 = uVar29 + 1;
    lVar18 = lVar18 + 0x240;
    pbVar30 = pbVar30 + 0x6f8;
    if (*psVar2 <= uVar29) {
      return Working;
    }
  } while( true );
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }